

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

lws_check_basic_auth_results
lws_check_basic_auth(lws *wsi,char *basic_auth_login_file,uint auth_mode)

{
  byte bVar1;
  char cVar2;
  allocated_headers *paVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ssize_t sVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  char plain [120];
  char b64 [160];
  char local_b8 [136];
  
  if (basic_auth_login_file == (char *)0x0 && auth_mode == 0) {
    return LCBA_CONTINUE;
  }
  iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
  if (iVar4 == 0) {
    return LCBA_FAILED_AUTH;
  }
  paVar3 = (wsi->http).ah;
  bVar1 = paVar3->frag_index[0x19];
  if (paVar3->frags[bVar1].nfrag != '\0') {
    _lws_log(1,"fragmented basic auth header not allowed\n");
    return LCBA_FAILED_AUTH;
  }
  iVar5 = lws_hdr_copy(wsi,b64,0xa0,WSI_TOKEN_HTTP_AUTHORIZATION);
  if (iVar5 < 7) {
    pcVar9 = "b64 auth too long\n";
  }
  else {
    b64[5] = '\0';
    iVar5 = strcasecmp(b64,"Basic");
    if (iVar5 != 0) {
      _lws_log(1,"auth missing basic: %s\n",b64);
      return LCBA_END_TRANSACTION;
    }
    uVar6 = lws_b64_decode_string(b64 + 6,plain,0x77);
    if ((int)uVar6 < 0) {
      pcVar9 = "plain auth too long\n";
    }
    else {
      plain[uVar6] = '\0';
      pcVar9 = strchr(plain,0x3a);
      if (pcVar9 != (char *)0x0) {
        if (auth_mode == 0x10000000) {
          iVar5 = (*wsi->protocol->callback)
                            (wsi,LWS_CALLBACK_VERIFY_BASIC_AUTHORIZATION,wsi->user_space,plain,
                             (ulong)uVar6);
          if (iVar5 == 0) {
            return LCBA_FAILED_AUTH;
          }
        }
        else {
          if (auth_mode != 0) {
            return LCBA_FAILED_AUTH;
          }
          uVar10 = 0;
          iVar5 = lws_open(basic_auth_login_file,0);
          if (iVar5 < 0) {
            _lws_log(1,"can\'t open auth file: %s\n",basic_auth_login_file);
LAB_00134edb:
            _lws_log(1,"%s: basic auth lookup failed\n","lws_check_basic_auth");
            return LCBA_FAILED_AUTH;
          }
          iVar8 = 0;
          sVar7 = 0;
          while( true ) {
            if (iVar8 == (int)sVar7) {
              sVar7 = read(iVar5,local_b8,0x80);
              iVar8 = 0;
              if ((int)sVar7 < 1) {
                close(iVar5);
                if (uVar10 != uVar6) goto LAB_00134edb;
                goto LAB_00134e6f;
              }
            }
            cVar2 = local_b8[iVar8];
            if ((uVar10 == uVar6) && ((cVar2 == '\n' || (uVar10 = 0, cVar2 == '\r')))) break;
            if (cVar2 == plain[(int)uVar10]) {
              uVar10 = uVar10 + 1;
            }
            else {
              uVar10 = 0;
            }
            iVar8 = iVar8 + 1;
          }
          close(iVar5);
        }
LAB_00134e6f:
        *pcVar9 = '\0';
        ((wsi->http).ah)->frags[bVar1].len = (short)pcVar9 - (short)plain;
        pcVar9 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
        strncpy(pcVar9,plain,(long)iVar4 - 1);
        pcVar9[(long)iVar4 + -1] = '\0';
        pcVar9 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
        _lws_log(8,"%s: basic auth accepted for %s\n","lws_check_basic_auth",pcVar9);
        return LCBA_CONTINUE;
      }
      pcVar9 = "basic auth format broken\n";
    }
  }
  _lws_log(1,pcVar9);
  return LCBA_END_TRANSACTION;
}

Assistant:

enum lws_check_basic_auth_results
lws_check_basic_auth(struct lws *wsi, const char *basic_auth_login_file,
		     unsigned int auth_mode)
{
#if defined(LWS_WITH_FILE_OPS)
	char b64[160], plain[(sizeof(b64) * 3) / 4], *pcolon;
	int m, ml, fi, bar;

	if (!basic_auth_login_file && auth_mode == LWSAUTHM_DEFAULT)
		return LCBA_CONTINUE;

	/* Did he send auth? */
	ml = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_AUTHORIZATION);
	if (!ml)
		return LCBA_FAILED_AUTH;

	/* Disallow fragmentation monkey business */

	fi = wsi->http.ah->frag_index[WSI_TOKEN_HTTP_AUTHORIZATION];
	if (wsi->http.ah->frags[fi].nfrag) {
		lwsl_err("fragmented basic auth header not allowed\n");
		return LCBA_FAILED_AUTH;
	}

	m = lws_hdr_copy(wsi, b64, sizeof(b64),
			 WSI_TOKEN_HTTP_AUTHORIZATION);
	if (m < 7) {
		lwsl_err("b64 auth too long\n");
		return LCBA_END_TRANSACTION;
	}

	b64[5] = '\0';
	if (strcasecmp(b64, "Basic")) {
		lwsl_err("auth missing basic: %s\n", b64);
		return LCBA_END_TRANSACTION;
	}

	/* It'll be like Authorization: Basic QWxhZGRpbjpPcGVuU2VzYW1l */

	m = lws_b64_decode_string(b64 + 6, plain, sizeof(plain) - 1);
	if (m < 0) {
		lwsl_err("plain auth too long\n");
		return LCBA_END_TRANSACTION;
	}

	plain[m] = '\0';
	pcolon = strchr(plain, ':');
	if (!pcolon) {
		lwsl_err("basic auth format broken\n");
		return LCBA_END_TRANSACTION;
	}

	switch (auth_mode) {
	case LWSAUTHM_DEFAULT:
		if (lws_find_string_in_file(basic_auth_login_file, plain, m))
			break;
		lwsl_err("%s: basic auth lookup failed\n", __func__);
		return LCBA_FAILED_AUTH;

	case LWSAUTHM_BASIC_AUTH_CALLBACK:
		bar = wsi->protocol->callback(wsi,
				LWS_CALLBACK_VERIFY_BASIC_AUTHORIZATION,
				wsi->user_space, plain, m);
		if (!bar)
			return LCBA_FAILED_AUTH;
		break;
	default:
		/* Invalid auth mode so lets fail all authentication attempts */
		return LCBA_FAILED_AUTH;
	}

	/*
	 * Rewrite WSI_TOKEN_HTTP_AUTHORIZATION so it is just the
	 * authorized username
	 */

	*pcolon = '\0';
	wsi->http.ah->frags[fi].len = lws_ptr_diff(pcolon, plain);
	pcolon = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_AUTHORIZATION);
	strncpy(pcolon, plain, ml - 1);
	pcolon[ml - 1] = '\0';
	lwsl_info("%s: basic auth accepted for %s\n", __func__,
		 lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_AUTHORIZATION));

	return LCBA_CONTINUE;
#else
	return LCBA_FAILED_AUTH;
#endif
}